

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O2

void soplex::initConstVecs<double>
               (SVSetBase<double> *vecset,SVSetBase<double> *facset,SSVectorBase<double> *veclogs,
               SSVectorBase<double> *vecnnzinv,double epsilon)

{
  uint uVar1;
  int iVar2;
  Item *pIVar3;
  Nonzero<double> *pNVar4;
  SVectorBase<double> *this;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double __x;
  double dVar9;
  double nnzinv;
  double local_68;
  SVSetBase<double> *local_60;
  SVSetBase<double> *local_58;
  SSVectorBase<double> *local_50;
  SSVectorBase<double> *local_48;
  ulong local_40;
  double local_38;
  
  uVar1 = (vecset->set).thenum;
  uVar6 = 0;
  local_40 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    local_40 = uVar6;
  }
  local_60 = facset;
  local_58 = vecset;
  local_50 = veclogs;
  local_48 = vecnnzinv;
  for (; uVar6 != local_40; uVar6 = uVar6 + 1) {
    pIVar3 = (local_58->set).theitem;
    iVar5 = (local_58->set).thekey[uVar6].idx;
    uVar1 = pIVar3[iVar5].data.super_SVectorBase<double>.memused;
    uVar7 = 0;
    uVar8 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar8 = uVar7;
    }
    pIVar3 = pIVar3 + iVar5;
    dVar9 = 0.0;
    iVar5 = 0;
    for (; uVar8 * 0x10 != uVar7; uVar7 = uVar7 + 0x10) {
      __x = ABS(*(double *)((long)&((pIVar3->data).super_SVectorBase<double>.m_elem)->val + uVar7));
      if (epsilon < __x) {
        local_38 = dVar9;
        dVar9 = log2(__x);
        dVar9 = local_38 + dVar9;
        iVar5 = iVar5 + 1;
      }
    }
    if (iVar5 < 1) {
      local_68 = 1.0;
      dVar9 = 1.0;
    }
    else {
      local_68 = 1.0 / (double)iVar5;
    }
    iVar2 = (local_50->super_IdxSet).num;
    (local_50->super_IdxSet).num = iVar2 + 1;
    (local_50->super_IdxSet).idx[iVar2] = (int)uVar6;
    (local_50->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar6] = dVar9;
    iVar2 = (local_48->super_IdxSet).num;
    (local_48->super_IdxSet).num = iVar2 + 1;
    (local_48->super_IdxSet).idx[iVar2] = (int)uVar6;
    (local_48->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar6] = local_68;
    this = SVSetBase<double>::create(local_60,iVar5);
    for (uVar7 = 0; uVar8 * 0x10 != uVar7; uVar7 = uVar7 + 0x10) {
      pNVar4 = (pIVar3->data).super_SVectorBase<double>.m_elem;
      if (epsilon < ABS(*(double *)((long)&pNVar4->val + uVar7))) {
        SVectorBase<double>::add(this,*(int *)((long)&pNVar4->idx + uVar7),&local_68);
      }
    }
    SVectorBase<double>::sort(this);
  }
  return;
}

Assistant:

static void initConstVecs(
   const SVSetBase<R>* vecset,
   SVSetBase<R>& facset,
   SSVectorBase<R>& veclogs,
   SSVectorBase<R>& vecnnzinv,
   R epsilon)
{
   assert(vecset != nullptr);

   const int nvec = vecset->num();

   for(int k = 0; k < nvec; ++k)
   {
      R logsum = 0.0;
      int nnz = 0;
      // get kth row or column of LP
      const SVectorBase<R>& lpvec = (*vecset)[k];
      const int size = lpvec.size();

      for(int i = 0; i < size; ++i)
      {
         const R a = lpvec.value(i);

         if(!isZero(a, epsilon))
         {
            logsum += log2(double(spxAbs(a))); // todo spxLog2?
            nnz++;
         }
      }

      R nnzinv;

      if(nnz > 0)
      {
         nnzinv = 1.0 / nnz;
      }
      else
      {
         /* all-0 entries */
         logsum = 1.0;
         nnzinv = 1.0;
      }

      veclogs.add(k, logsum);
      vecnnzinv.add(k, nnzinv);

      /* create new VectorBase<R> for facset */
      SVectorBase<R>& vecnew = (*(facset.create(nnz)));

      for(int i = 0; i < size; ++i)
      {
         if(!isZero(lpvec.value(i), epsilon))
            vecnew.add(lpvec.index(i), nnzinv);
      }

      vecnew.sort();
   }

   assert(veclogs.isSetup());
   assert(vecnnzinv.isSetup());
}